

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O0

void __thiscall
TEST_ScoringTableTest_DealerSelfDrawn_Test::testBody
          (TEST_ScoringTableTest_DealerSelfDrawn_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 in_stack_fffffffffffff878;
  undefined8 uVar7;
  NormalTestTerminator *pNVar8;
  NormalTestTerminator local_260;
  NormalTestTerminator local_258;
  SimpleString local_250;
  SimpleString local_248;
  NormalTestTerminator local_240;
  NormalTestTerminator local_238;
  SimpleString local_230;
  SimpleString local_228;
  NormalTestTerminator local_220;
  NormalTestTerminator local_218;
  SimpleString local_210;
  SimpleString local_208;
  NormalTestTerminator local_200;
  NormalTestTerminator local_1f8;
  SimpleString local_1f0;
  SimpleString local_1e8;
  NormalTestTerminator local_1e0;
  NormalTestTerminator local_1d8;
  SimpleString local_1d0;
  SimpleString local_1c8;
  NormalTestTerminator local_1c0;
  NormalTestTerminator local_1b8;
  SimpleString local_1b0;
  SimpleString local_1a8;
  NormalTestTerminator local_1a0;
  NormalTestTerminator local_198;
  SimpleString local_190;
  SimpleString local_188;
  NormalTestTerminator local_180;
  NormalTestTerminator local_178;
  SimpleString local_170;
  SimpleString local_168;
  NormalTestTerminator local_160;
  NormalTestTerminator local_158;
  SimpleString local_150;
  SimpleString local_148;
  NormalTestTerminator local_140;
  NormalTestTerminator local_138;
  SimpleString local_130;
  SimpleString local_128;
  NormalTestTerminator local_120;
  NormalTestTerminator local_118;
  SimpleString local_110;
  SimpleString local_108;
  NormalTestTerminator local_100;
  NormalTestTerminator local_f8;
  SimpleString local_f0;
  SimpleString local_e8;
  NormalTestTerminator local_e0;
  NormalTestTerminator local_d8;
  SimpleString local_d0;
  SimpleString local_c8;
  NormalTestTerminator local_c0;
  NormalTestTerminator local_b8;
  SimpleString local_b0;
  SimpleString local_a8;
  NormalTestTerminator local_a0;
  NormalTestTerminator local_98;
  SimpleString local_90;
  SimpleString local_88;
  NormalTestTerminator local_80;
  NormalTestTerminator local_78;
  SimpleString local_70;
  SimpleString local_68;
  NormalTestTerminator local_60;
  NormalTestTerminator local_58;
  SimpleString local_50;
  SimpleString local_48;
  NormalTestTerminator local_40;
  NormalTestTerminator local_38;
  SimpleString local_30 [3];
  SimpleString local_18;
  TEST_ScoringTableTest_DealerSelfDrawn_Test *local_10;
  TEST_ScoringTableTest_DealerSelfDrawn_Test *this_local;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff878 >> 0x20);
  local_10 = this;
  iVar1 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x1e);
  if (iVar1 == 500) {
    pUVar4 = UtestShell::getCurrent();
    local_40.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_40;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x27);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c824a);
  }
  else {
    iVar1 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x1e);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x1e);
    if (iVar1 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x27);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar3);
    pcVar5 = SimpleString::asCharString(&local_18);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x1e);
    StringFrom(iVar3);
    pcVar6 = SimpleString::asCharString(local_30);
    local_38.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_38);
    uVar7 = CONCAT44(iVar3,0x27);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_38);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c818a);
    SimpleString::~SimpleString((SimpleString *)0x1c8193);
    SimpleString::~SimpleString((SimpleString *)0x1c819c);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x28);
  if (iVar3 == 700) {
    pUVar4 = UtestShell::getCurrent();
    local_60.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_60;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x28);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c849d);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x28);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x28);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x28);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x28);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_50);
    local_58.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_58);
    uVar7 = CONCAT44(iVar1,0x28);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_58);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c83dd);
    SimpleString::~SimpleString((SimpleString *)0x1c83e6);
    SimpleString::~SimpleString((SimpleString *)0x1c83ef);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x32);
  if (iVar3 == 800) {
    pUVar4 = UtestShell::getCurrent();
    local_80.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_80;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x29);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c86f0);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x32);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x32);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x29);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_68);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x32);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_70);
    local_78.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_78);
    uVar7 = CONCAT44(iVar1,0x29);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_78);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c8630);
    SimpleString::~SimpleString((SimpleString *)0x1c8639);
    SimpleString::~SimpleString((SimpleString *)0x1c8642);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x3c);
  if (iVar3 == 1000) {
    pUVar4 = UtestShell::getCurrent();
    local_a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_a0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x2a);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c8964);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x3c);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x3c);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x2a);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_88);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x3c);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_90);
    local_98.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_98);
    uVar7 = CONCAT44(iVar1,0x2a);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_98);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c8892);
    SimpleString::~SimpleString((SimpleString *)0x1c889e);
    SimpleString::~SimpleString((SimpleString *)0x1c88a7);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x46);
  if (iVar3 == 0x4b0) {
    pUVar4 = UtestShell::getCurrent();
    local_c0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_c0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x2b);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c8be4);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x46);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x46);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x2b);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_a8);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x46);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_b8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_b8);
    uVar7 = CONCAT44(iVar1,0x2b);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_b8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c8b0c);
    SimpleString::~SimpleString((SimpleString *)0x1c8b18);
    SimpleString::~SimpleString((SimpleString *)0x1c8b24);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x14);
  if (iVar3 == 700) {
    pUVar4 = UtestShell::getCurrent();
    local_e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_e0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x2d);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c8e64);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x14);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x14);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x2d);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_c8);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x14);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_d0);
    local_d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_d8);
    uVar7 = CONCAT44(iVar1,0x2d);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_d8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c8d8c);
    SimpleString::~SimpleString((SimpleString *)0x1c8d98);
    SimpleString::~SimpleString((SimpleString *)0x1c8da4);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x1e);
  if (iVar3 == 1000) {
    pUVar4 = UtestShell::getCurrent();
    local_100.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_100;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x2e);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c90e4);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x1e);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x1e);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x2e);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_e8);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x1e);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_f0);
    local_f8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_f8);
    uVar7 = CONCAT44(iVar1,0x2e);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_f8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c900c);
    SimpleString::~SimpleString((SimpleString *)0x1c9018);
    SimpleString::~SimpleString((SimpleString *)0x1c9024);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x28);
  if (iVar3 == 0x514) {
    pUVar4 = UtestShell::getCurrent();
    local_120.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_120;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x2f);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c9364);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x28);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x28);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x2f);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_108);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x28);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_110);
    local_118.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_118);
    uVar7 = CONCAT44(iVar1,0x2f);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_118);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c928c);
    SimpleString::~SimpleString((SimpleString *)0x1c9298);
    SimpleString::~SimpleString((SimpleString *)0x1c92a4);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x32);
  if (iVar3 == 0x640) {
    pUVar4 = UtestShell::getCurrent();
    local_140.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_140;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x30);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c95e4);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x32);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x32);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x30);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_128);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x32);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_130);
    local_138.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_138);
    uVar7 = CONCAT44(iVar1,0x30);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_138);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c950c);
    SimpleString::~SimpleString((SimpleString *)0x1c9518);
    SimpleString::~SimpleString((SimpleString *)0x1c9524);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x3c);
  if (iVar3 == 2000) {
    pUVar4 = UtestShell::getCurrent();
    local_160.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_160;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x31);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c9864);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x3c);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x3c);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x31);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_148);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x3c);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_150);
    local_158.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_158);
    uVar7 = CONCAT44(iVar1,0x31);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_158);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c978c);
    SimpleString::~SimpleString((SimpleString *)0x1c9798);
    SimpleString::~SimpleString((SimpleString *)0x1c97a4);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x46);
  if (iVar3 == 0x8fc) {
    pUVar4 = UtestShell::getCurrent();
    local_180.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_180;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x32);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c9ae4);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x46);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x46);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x32);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_168);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x46);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_170);
    local_178.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_178);
    uVar7 = CONCAT44(iVar1,0x32);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_178);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c9a0c);
    SimpleString::~SimpleString((SimpleString *)0x1c9a18);
    SimpleString::~SimpleString((SimpleString *)0x1c9a24);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x14);
  if (iVar3 == 0x514) {
    pUVar4 = UtestShell::getCurrent();
    local_1a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_1a0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x34);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c9d64);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x14);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x14);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x34);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_188);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x14);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_190);
    local_198.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_198);
    uVar7 = CONCAT44(iVar1,0x34);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_198);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c9c8c);
    SimpleString::~SimpleString((SimpleString *)0x1c9c98);
    SimpleString::~SimpleString((SimpleString *)0x1c9ca4);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x1e);
  if (iVar3 == 2000) {
    pUVar4 = UtestShell::getCurrent();
    local_1c0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_1c0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x35);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c9fe4);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x1e);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x1e);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x35);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_1a8);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x1e);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_1b0);
    local_1b8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1b8);
    uVar7 = CONCAT44(iVar1,0x35);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_1b8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c9f0c);
    SimpleString::~SimpleString((SimpleString *)0x1c9f18);
    SimpleString::~SimpleString((SimpleString *)0x1c9f24);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x28);
  if (iVar3 == 0xa28) {
    pUVar4 = UtestShell::getCurrent();
    local_1e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_1e0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x36);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ca264);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x28);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x28);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x36);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_1c8);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x28);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_1d0);
    local_1d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1d8);
    uVar7 = CONCAT44(iVar1,0x36);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_1d8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ca18c);
    SimpleString::~SimpleString((SimpleString *)0x1ca198);
    SimpleString::~SimpleString((SimpleString *)0x1ca1a4);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x32);
  if (iVar3 == 0xc80) {
    pUVar4 = UtestShell::getCurrent();
    local_200.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_200;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x37);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ca4e4);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x32);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x32);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x37);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_1e8);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x32);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_1f0);
    local_1f8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1f8);
    uVar7 = CONCAT44(iVar1,0x37);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_1f8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ca40c);
    SimpleString::~SimpleString((SimpleString *)0x1ca418);
    SimpleString::~SimpleString((SimpleString *)0x1ca424);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x3c);
  if (iVar3 == 0xf3c) {
    pUVar4 = UtestShell::getCurrent();
    local_220.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_220;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x38);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ca764);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x3c);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x3c);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x38);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_208);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x3c);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_210);
    local_218.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_218);
    uVar7 = CONCAT44(iVar1,0x38);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_218);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ca68c);
    SimpleString::~SimpleString((SimpleString *)0x1ca698);
    SimpleString::~SimpleString((SimpleString *)0x1ca6a4);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x14);
  if (iVar3 == 0xa28) {
    pUVar4 = UtestShell::getCurrent();
    local_240.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_240;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x3a);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ca9e4);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x14);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x14);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x3a);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_228);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,
               0x14);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_230);
    local_238.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_238);
    uVar7 = CONCAT44(iVar1,0x3a);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_238);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ca90c);
    SimpleString::~SimpleString((SimpleString *)0x1ca918);
    SimpleString::~SimpleString((SimpleString *)0x1ca924);
  }
  iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x1e);
  if (iVar3 == 0xf3c) {
    pUVar4 = UtestShell::getCurrent();
    local_260.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_260);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x3b,&local_260);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cac64);
  }
  else {
    iVar3 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x1e);
    iVar2 = mahjong::ScoringTable::dealerSelfDrawn
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x1e);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x3b);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_248);
    mahjong::ScoringTable::dealerSelfDrawn
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,
               0x1e);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_250);
    local_258.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_258);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,CONCAT44(iVar1,0x3b),&local_258);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cab8c);
    SimpleString::~SimpleString((SimpleString *)0x1cab98);
    SimpleString::~SimpleString((SimpleString *)0x1caba4);
  }
  return;
}

Assistant:

TEST(ScoringTableTest, DealerSelfDrawn)
{
	CHECK_EQUAL(500, t.dealerSelfDrawn(1, 30));
	CHECK_EQUAL(700, t.dealerSelfDrawn(1, 40));
	CHECK_EQUAL(800, t.dealerSelfDrawn(1, 50));
	CHECK_EQUAL(1000, t.dealerSelfDrawn(1, 60));
	CHECK_EQUAL(1200, t.dealerSelfDrawn(1, 70));

	CHECK_EQUAL(700, t.dealerSelfDrawn(2, 20));
	CHECK_EQUAL(1000, t.dealerSelfDrawn(2, 30));
	CHECK_EQUAL(1300, t.dealerSelfDrawn(2, 40));
	CHECK_EQUAL(1600, t.dealerSelfDrawn(2, 50));
	CHECK_EQUAL(2000, t.dealerSelfDrawn(2, 60));
	CHECK_EQUAL(2300, t.dealerSelfDrawn(2, 70));

	CHECK_EQUAL(1300, t.dealerSelfDrawn(3, 20));
	CHECK_EQUAL(2000, t.dealerSelfDrawn(3, 30));
	CHECK_EQUAL(2600, t.dealerSelfDrawn(3, 40));
	CHECK_EQUAL(3200, t.dealerSelfDrawn(3, 50));
	CHECK_EQUAL(3900, t.dealerSelfDrawn(3, 60));

	CHECK_EQUAL(2600, t.dealerSelfDrawn(4, 20));
	CHECK_EQUAL(3900, t.dealerSelfDrawn(4, 30));
}